

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachments2
          (Impl *this,Value *attachments,VkAttachmentReference2 **out_references)

{
  bool bVar1;
  SizeType SVar2;
  uint uVar3;
  VkAttachmentReference2 *pVVar4;
  ConstValueIterator pGVar5;
  Type pGVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *value;
  ConstValueIterator itr;
  VkAttachmentReference2 *ret;
  VkAttachmentReference2 *refs;
  VkAttachmentReference2 **out_references_local;
  Value *attachments_local;
  Impl *this_local;
  
  SVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(attachments);
  pVVar4 = ScratchAllocator::allocate_n_cleared<VkAttachmentReference2>
                     (&this->allocator,(ulong)SVar2);
  value = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Begin(attachments);
  ret = pVVar4;
  do {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(attachments);
    if (value == pGVar5) {
      *out_references = pVVar4;
      return true;
    }
    ret->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
    parse_attachment_base<VkAttachmentReference2>(ret,value);
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"aspectMask");
    uVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar6);
    ret->aspectMask = uVar3;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(value,"pNext");
    if (bVar1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)value,"pNext");
      bVar1 = parse_pnext_chain(this,pGVar6,&ret->pNext,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar1) {
        return false;
      }
    }
    value = value + 1;
    ret = ret + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_attachments2(const Value &attachments, const VkAttachmentReference2 **out_references)
{
	auto *refs = allocator.allocate_n_cleared<VkAttachmentReference2>(attachments.Size());
	auto *ret = refs;

	for (auto itr = attachments.Begin(); itr != attachments.End(); ++itr, refs++)
	{
		auto &value = *itr;
		refs->sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
		parse_attachment_base(*refs, value);
		refs->aspectMask = value["aspectMask"].GetUint();

		if (value.HasMember("pNext"))
			if (!parse_pnext_chain(value["pNext"], &refs->pNext))
				return false;
	}

	*out_references = ret;
	return true;
}